

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_set_car(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *this;
  uint64_t in_RDX;
  string error;
  operand local_6c [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this = label;
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_40,this,in_RDX);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (ops->safe_primitives == true) {
    local_40._M_dataplus._M_p._0_4_ = 5;
    local_6c[0] = R11;
    local_6c[2] = 0x39;
    local_6c[1] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_40,local_6c,local_6c + 2,(int *)(local_6c + 1));
    local_40._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_40,&local_60);
    jump_short_if_arg_is_not_block(code,RCX,R11,&local_60);
  }
  local_6c[0] = AH;
  local_6c[2] = 0xb;
  local_6c[1] = 0x39;
  local_40._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_6c,local_6c + 2,local_6c + 1,(unsigned_long *)&local_40);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RCX,R11,&local_60);
  }
  local_40._M_dataplus._M_p._0_4_ = 0x40;
  local_6c[0] = MEM_RCX;
  local_6c[2] = 8;
  local_6c[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_40,local_6c,(int *)(local_6c + 2),local_6c + 1);
  local_40._M_dataplus._M_p._0_4_ = 0x2c;
  local_6c[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_40,local_6c);
  if (ops->safe_primitives == true) {
    error_label(code,&local_60,re_set_car_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_set_car(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  if (ops.safe_primitives)
    {
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether it contains a pair
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_pair(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(1), asmcode::RDX);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_set_car_contract_violation);
    }
  }